

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_pointer_kernel_1.h
# Opt level: O2

void __thiscall
dlib::bound_function_pointer::swap(bound_function_pointer *this,bound_function_pointer *item)

{
  long *plVar1;
  bound_function_pointer temp;
  long local_a8 [16];
  long *local_28;
  
  local_28 = local_a8;
  (**(code **)(*(item->bf_memory).data + 0x20))();
  (*(code *)**(item->bf_memory).data)();
  plVar1 = (long *)(this->bf_memory).data;
  (**(code **)(*plVar1 + 0x20))(plVar1,(item->bf_memory).data);
  (*(code *)**(this->bf_memory).data)();
  (**(code **)(*local_28 + 0x20))(local_28,(this->bf_memory).data);
  (**(code **)*local_28)();
  return;
}

Assistant:

void swap (
            bound_function_pointer& item
        )
        {
            // make a temp copy of item
            bound_function_pointer temp(item);

            // destory the stuff in item
            item.destroy_bf_memory();
            // copy *this into item
            bf()->clone(item.bf_memory.get());

            // destory the stuff in this 
            destroy_bf_memory();
            // copy temp into *this
            temp.bf()->clone(bf_memory.get());
        }